

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O3

void duckdb::ApproxTopKOperation::Operation<duckdb::string_t,duckdb::ApproxTopKState>
               (ApproxTopKState *aggr_state,string_t *input,AggregateInputData *aggr_input,
               Vector *top_k_vector,idx_t offset,idx_t count)

{
  ulong kval;
  undefined8 uVar1;
  char *pcVar2;
  InternalApproxTopKState *this;
  __node_base_ptr p_Var3;
  InvalidInputException *pIVar4;
  ApproxTopKString topk_string;
  string local_a0;
  AggregateInputData *local_80;
  anon_union_16_2_67f50693_for_value local_78;
  ulong local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_80 = aggr_input;
  this = ApproxTopKState::GetState(aggr_state);
  if ((this->values).
      super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->values).
      super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78.pointer);
    duckdb::Vector::ToUnifiedFormat((ulong)top_k_vector,(UnifiedVectorFormat *)count);
    if (*(long *)local_78._0_8_ != 0) {
      offset = (idx_t)*(uint *)(*(long *)local_78._0_8_ + offset * 4);
    }
    if ((local_68 != 0) && ((*(ulong *)(local_68 + (offset >> 6) * 8) >> (offset & 0x3f) & 1) == 0))
    {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Invalid input for approx_top_k: k value cannot be NULL","");
      duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)&local_a0);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    kval = *(ulong *)(local_78.pointer.ptr + offset * 8);
    if ((long)kval < 1) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Invalid input for approx_top_k: k value must be > 0","");
      duckdb::InvalidInputException::InvalidInputException(pIVar4,(string *)&local_a0);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (999999 < kval) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Invalid input for approx_top_k: k value must be < %d","");
      InvalidInputException::InvalidInputException<long>(pIVar4,&local_a0,1000000);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    InternalApproxTopKState::Initialize(this,kval);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  uVar1 = *(undefined8 *)&input->value;
  pcVar2 = (input->value).pointer.ptr;
  local_68 = duckdb::Hash<duckdb::string_t>((string_t)(input->value).pointer);
  local_78._0_8_ = uVar1;
  local_78.pointer.ptr = pcVar2;
  p_Var3 = std::
           _Hashtable<duckdb::ApproxTopKString,_std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>,_std::allocator<std::pair<const_duckdb::ApproxTopKString,_std::reference_wrapper<duckdb::ApproxTopKValue>_>_>,_std::__detail::_Select1st,_duckdb::ApproxTopKEquality,_duckdb::ApproxTopKHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->lookup_map)._M_h,local_68 % (this->lookup_map)._M_h._M_bucket_count,
                      (key_type *)&local_78.pointer,local_68);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    InternalApproxTopKState::InsertOrReplaceEntry
              (this,(ApproxTopKString *)&local_78.pointer,local_80,1);
  }
  else {
    InternalApproxTopKState::IncrementCount(this,(ApproxTopKValue *)p_Var3->_M_nxt[4]._M_nxt,1);
  }
  return;
}

Assistant:

static void Operation(STATE &aggr_state, const TYPE &input, AggregateInputData &aggr_input, Vector &top_k_vector,
	                      idx_t offset, idx_t count) {
		auto &state = aggr_state.GetState();
		if (state.values.empty()) {
			static constexpr int64_t MAX_APPROX_K = 1000000;
			// not initialized yet - initialize the K value and set all counters to 0
			UnifiedVectorFormat kdata;
			top_k_vector.ToUnifiedFormat(count, kdata);
			auto kidx = kdata.sel->get_index(offset);
			if (!kdata.validity.RowIsValid(kidx)) {
				throw InvalidInputException("Invalid input for approx_top_k: k value cannot be NULL");
			}
			auto kval = UnifiedVectorFormat::GetData<int64_t>(kdata)[kidx];
			if (kval <= 0) {
				throw InvalidInputException("Invalid input for approx_top_k: k value must be > 0");
			}
			if (kval >= MAX_APPROX_K) {
				throw InvalidInputException("Invalid input for approx_top_k: k value must be < %d", MAX_APPROX_K);
			}
			state.Initialize(UnsafeNumericCast<idx_t>(kval));
		}
		ApproxTopKString topk_string(input, Hash(input));
		auto entry = state.lookup_map.find(topk_string);
		if (entry != state.lookup_map.end()) {
			// the input is monitored - increment the count
			state.IncrementCount(entry->second.get());
		} else {
			// the input is not monitored - replace the first entry with the current entry and increment
			state.InsertOrReplaceEntry(topk_string, aggr_input);
		}
	}